

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

bool __thiscall
QScrollerPrivate::releaseWhileDragging(QScrollerPrivate *this,QPointF *position,qint64 timestamp)

{
  qreal *this_00;
  QScrollerPropertiesPrivate *pQVar1;
  QScroller *this_01;
  ulong uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  QDebug *pQVar6;
  bool bVar7;
  State newstate;
  long in_FS_OFFSET;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  QPointF QVar15;
  QPointF local_98;
  undefined4 uStack_88;
  undefined4 local_84;
  char *local_80;
  QDebug local_70;
  QPointF local_68;
  QPointF local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->properties).d.d;
  this_01 = this->q_ptr;
  handleDrag(this,position,timestamp);
  dVar11 = position->xp;
  dVar14 = position->yp;
  dVar12 = (this->pressPosition).xp;
  dVar3 = (this->pressPosition).yp;
  QVar15 = QScroller::pixelPerMeter(this_01);
  auVar4._8_8_ = dVar14 - dVar3;
  auVar4._0_8_ = dVar11 - dVar12;
  auVar13 = divpd(auVar4,(undefined1  [16])QVar15);
  dVar11 = auVar13._0_8_;
  dVar14 = auVar13._8_8_;
  uVar8 = -(ulong)(dVar11 < -dVar11);
  uVar9 = -(ulong)(dVar14 < -dVar14);
  uVar2 = (ulong)-dVar14 & uVar9;
  auVar10._0_8_ = ~uVar8 & (ulong)dVar11;
  auVar10._8_8_ = ~uVar9 & (ulong)dVar14;
  auVar13._8_4_ = (int)uVar2;
  auVar13._0_8_ = (ulong)-dVar11 & uVar8;
  auVar13._12_4_ = (int)(uVar2 >> 0x20);
  dVar11 = SUB168(auVar10 | auVar13,8) + SUB168(auVar10 | auVar13,0);
  if (pQVar1->dragStartDistance <= dVar11 && dVar11 != pQVar1->dragStartDistance) {
    local_98.xp._0_4_ = 0;
    local_98.xp._4_4_ = 0;
    local_98.yp._0_4_ = 0;
    local_98.yp._4_4_ = 0;
    bVar5 = ::operator!=(&this->oldVelocity,&local_98);
    if (bVar5) {
      dVar11 = pQVar1->acceleratingFlickMaximumTime;
      if (((dVar11 != 0.0) || (NAN(dVar11))) &&
         (timestamp - this->pressTimestamp < (long)(dVar11 * 1000.0))) {
        dVar11 = (this->releaseVelocity).xp;
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          bVar5 = 0.0 < dVar11 != (this->oldVelocity).xp <= 0.0;
        }
        else {
          bVar5 = false;
        }
        dVar11 = (this->releaseVelocity).yp;
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          bVar7 = (this->oldVelocity).yp <= 0.0 != 0.0 < dVar11;
        }
        else {
          bVar7 = false;
        }
        if (bVar5) {
          dVar11 = pQVar1->maximumVelocity;
          dVar12 = (this->oldVelocity).xp * pQVar1->acceleratingFlickSpeedupFactor;
          dVar14 = dVar11;
          if (dVar12 <= dVar11) {
            dVar14 = dVar12;
          }
          if (dVar14 <= -dVar11) {
            dVar14 = -dVar11;
          }
          (this->releaseVelocity).xp = dVar14;
        }
        if (bVar7) {
          dVar11 = pQVar1->maximumVelocity;
          dVar12 = (this->oldVelocity).yp * pQVar1->acceleratingFlickSpeedupFactor;
          dVar14 = dVar11;
          if (dVar12 <= dVar11) {
            dVar14 = dVar12;
          }
          if (dVar14 <= -dVar11) {
            dVar14 = -dVar11;
          }
          (this->releaseVelocity).yp = dVar14;
        }
      }
    }
  }
  QVar15 = QScroller::pixelPerMeter(this_01);
  local_48.yp = QVar15.yp;
  local_48.xp = QVar15.xp;
  local_98.xp = (this->overshootPosition).xp + (this->contentPosition).xp;
  local_98.yp = (this->overshootPosition).yp + (this->contentPosition).yp;
  createScrollingSegments(this,&this->releaseVelocity,&local_98,&local_48);
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_98.xp._0_4_ = 2;
    local_98.xp._4_4_ = 0;
    local_98.yp._0_4_ = 0;
    local_98.yp._4_4_ = 0;
    uStack_88 = 0;
    local_84 = 0;
    local_80 = lcScroller::category.name;
    QMessageLogger::debug();
    pQVar6 = QDebug::operator<<(&local_70,"QScroller::releaseWhileDragging() -- velocity:");
    local_68.xp = (qreal)pQVar6->stream;
    *(int *)((long)local_68.xp + 0x28) = *(int *)((long)local_68.xp + 0x28) + 1;
    this_00 = &local_68.yp;
    ::operator<<((QDebug)this_00,&local_68);
    pQVar6 = QDebug::operator<<((QDebug *)this_00,"-- minimum velocity:");
    pQVar6 = QDebug::operator<<(pQVar6,pQVar1->minimumVelocity);
    pQVar6 = QDebug::operator<<(pQVar6,"overshoot");
    local_58.xp = (qreal)pQVar6->stream;
    *(int *)((long)local_58.xp + 0x28) = *(int *)((long)local_58.xp + 0x28) + 1;
    ::operator<<((QDebug)&local_58.yp,&local_58);
    QDebug::~QDebug((QDebug *)&local_58.yp);
    QDebug::~QDebug((QDebug *)&local_58);
    QDebug::~QDebug((QDebug *)this_00);
    QDebug::~QDebug((QDebug *)&local_68);
    QDebug::~QDebug(&local_70);
  }
  if (((this->xSegments).super_QList<QScrollerPrivate::ScrollSegment>.d.size == 0) &&
     ((this->ySegments).super_QList<QScrollerPrivate::ScrollSegment>.d.size == 0)) {
    newstate = Inactive;
  }
  else {
    newstate = Scrolling;
  }
  setState(this,newstate);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QScrollerPrivate::releaseWhileDragging(const QPointF &position, qint64 timestamp)
{
    Q_Q(QScroller);
    const QScrollerPropertiesPrivate *sp = properties.d.data();

    // handleDrag updates lastPosition, lastTimestamp and velocity
    handleDrag(position, timestamp);

    // check if we moved at all - this can happen if you stop a running
    // scroller with a press and release shortly afterwards
    QPointF deltaPixel = position - pressPosition;
    if (((deltaPixel / q->pixelPerMeter()).manhattanLength()) > sp->dragStartDistance) {

        // handle accelerating flicks
        if ((oldVelocity != QPointF(0, 0)) && sp->acceleratingFlickMaximumTime &&
            ((timestamp - pressTimestamp) < qint64(sp->acceleratingFlickMaximumTime * 1000))) {

            // - determine if the direction was changed
            int signX = 0, signY = 0;
            if (releaseVelocity.x())
                signX = (releaseVelocity.x() > 0) == (oldVelocity.x() > 0) ? 1 : -1;
            if (releaseVelocity.y())
                signY = (releaseVelocity.y() > 0) == (oldVelocity.y() > 0) ? 1 : -1;

            if (signX > 0)
                releaseVelocity.setX(qBound(-sp->maximumVelocity,
                                            oldVelocity.x() * sp->acceleratingFlickSpeedupFactor,
                                            sp->maximumVelocity));
            if (signY > 0)
                releaseVelocity.setY(qBound(-sp->maximumVelocity,
                                            oldVelocity.y() * sp->acceleratingFlickSpeedupFactor,
                                            sp->maximumVelocity));
        }
    }

    QPointF ppm = q->pixelPerMeter();
    createScrollingSegments(releaseVelocity, contentPosition + overshootPosition, ppm);

    qCDebug(lcScroller) << "QScroller::releaseWhileDragging() -- velocity:" << releaseVelocity
                        << "-- minimum velocity:" << sp->minimumVelocity << "overshoot" << overshootPosition;

    if (xSegments.isEmpty() && ySegments.isEmpty())
        setState(QScroller::Inactive);
    else
        setState(QScroller::Scrolling);

    return true;
}